

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void iffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined8 uVar4;
  long StageCnt;
  byte bVar5;
  byte bVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [32];
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ushort uVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  float scale;
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ulong uVar14;
  
  auVar8 = _DAT_00107ae0;
  auVar1 = _DAT_00107a60;
  auVar31 = _DAT_001074c0;
  auVar30 = _DAT_00107480;
  scale = (float)(double)(0x3ff0000000000000 - (M << 0x34));
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      lVar12 = Rows + 1;
      do {
        auVar1 = *(undefined1 (*) [16])ioptr;
        auVar50 = vshufpd_avx(auVar1,auVar1,1);
        auVar52 = vsubps_avx(auVar50,auVar1);
        *(float *)*(undefined1 (*) [16])ioptr = (auVar50._0_4_ + auVar1._0_4_) * scale;
        *(float *)(*(undefined1 (*) [16])ioptr + 4) = (auVar50._4_4_ + auVar1._4_4_) * scale;
        *(float *)(*(undefined1 (*) [16])ioptr + 8) = auVar52._8_4_ * scale;
        *(float *)(*(undefined1 (*) [16])ioptr + 0xc) = auVar52._12_4_ * scale;
        ioptr = (float *)(*(undefined1 (*) [16])ioptr + (2L << (M & 0x3fU)) * 4);
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    break;
  case 2:
    if (0 < Rows) {
      lVar12 = Rows + 1;
      do {
        auVar2 = *(undefined1 (*) [32])ioptr;
        auVar28 = vpermpd_avx2(auVar2,0x4e);
        auVar53._0_4_ = auVar2._0_4_ + auVar28._0_4_;
        auVar53._4_4_ = auVar2._4_4_ + auVar28._4_4_;
        auVar53._8_4_ = auVar2._8_4_ + auVar28._8_4_;
        auVar53._12_4_ = auVar2._12_4_ + auVar28._12_4_;
        auVar53._16_4_ = auVar2._16_4_ + auVar28._16_4_;
        auVar53._20_4_ = auVar2._20_4_ + auVar28._20_4_;
        auVar53._24_4_ = auVar2._24_4_ + auVar28._24_4_;
        auVar53._28_4_ = auVar2._28_4_ + auVar28._28_4_;
        auVar2 = vsubps_avx(auVar2,auVar28);
        auVar28 = vpermt2ps_avx512vl(auVar53,auVar8,auVar2);
        auVar2 = vpermpd_avx2(auVar28,0x4e);
        auVar51._0_4_ = auVar28._0_4_ + auVar2._0_4_;
        auVar51._4_4_ = auVar28._4_4_ + auVar2._4_4_;
        auVar51._8_4_ = auVar28._8_4_ + auVar2._8_4_;
        auVar51._12_4_ = auVar28._12_4_ + auVar2._12_4_;
        auVar51._16_4_ = auVar28._16_4_ + auVar2._16_4_;
        auVar51._20_4_ = auVar28._20_4_ + auVar2._20_4_;
        auVar51._24_4_ = auVar28._24_4_ + auVar2._24_4_;
        auVar51._28_4_ = auVar28._28_4_ + auVar2._28_4_;
        auVar2 = vsubps_avx(auVar28,auVar2);
        auVar2 = vblendps_avx(auVar51,auVar2,0xb4);
        *(float *)*(undefined1 (*) [32])ioptr = auVar2._0_4_ * scale;
        *(float *)(*(undefined1 (*) [32])ioptr + 4) = auVar2._4_4_ * scale;
        *(float *)(*(undefined1 (*) [32])ioptr + 8) = auVar2._8_4_ * scale;
        *(float *)(*(undefined1 (*) [32])ioptr + 0xc) = auVar2._12_4_ * scale;
        *(float *)(*(undefined1 (*) [32])ioptr + 0x10) = auVar2._16_4_ * scale;
        *(float *)(*(undefined1 (*) [32])ioptr + 0x14) = auVar2._20_4_ * scale;
        *(float *)(*(undefined1 (*) [32])ioptr + 0x18) = auVar2._24_4_ * scale;
        *(int *)(*(undefined1 (*) [32])ioptr + 0x1c) = auVar2._28_4_;
        ioptr = (float *)(*(undefined1 (*) [32])ioptr + (2L << (M & 0x3fU)) * 4);
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    break;
  case 3:
    if (0 < Rows) {
      auVar32 = vbroadcastss_avx512f(ZEXT416((uint)scale));
      lVar12 = Rows + 1;
      auVar50._8_8_ = 0x500000000;
      auVar50._0_8_ = 0x500000000;
      auVar52._8_8_ = 0x400000000;
      auVar52._0_8_ = 0x400000000;
      auVar54._0_12_ = ZEXT412(0x40000000) << 0x40;
      auVar54._12_4_ = 0x40000000;
      do {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x20);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x30);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x28);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)*(undefined1 (*) [64])ioptr;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 8);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x10);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x18);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x38);
        auVar15 = vaddps_avx512vl(auVar24,auVar23);
        auVar16 = vaddps_avx512vl(auVar26,auVar59);
        auVar17 = vaddps_avx512vl(auVar16,auVar15);
        auVar18 = vaddps_avx512vl(auVar25,auVar21);
        auVar19 = vaddps_avx512vl(auVar62,auVar60);
        auVar20 = vaddps_avx512vl(auVar19,auVar18);
        auVar22 = vsubps_avx(auVar21,auVar25);
        auVar22 = vshufps_avx(auVar22,auVar22,0xe1);
        auVar27 = vsubps_avx(auVar60,auVar62);
        auVar61._0_4_ = auVar22._0_4_ + auVar27._0_4_;
        auVar61._4_4_ = auVar22._4_4_ + auVar27._4_4_;
        auVar61._8_4_ = auVar22._8_4_ + auVar27._8_4_;
        auVar61._12_4_ = auVar22._12_4_ + auVar27._12_4_;
        auVar27 = vsubps_avx(auVar22,auVar27);
        auVar22 = vblendps_avx(auVar61,auVar27,2);
        auVar58._0_4_ = auVar22._0_4_ * 0.70710677;
        auVar58._4_4_ = auVar22._4_4_ * 0.70710677;
        auVar58._8_4_ = auVar22._8_4_ * 0.70710677;
        auVar58._12_4_ = auVar22._12_4_ * 0.70710677;
        auVar25 = vmovshdup_avx(auVar58);
        auVar21 = vaddss_avx512f(auVar58,auVar25);
        auVar22 = vpermt2ps_avx512vl(auVar27,auVar1,auVar61);
        auVar56._0_4_ = auVar22._0_4_ * 0.70710677;
        auVar56._4_4_ = auVar22._4_4_ * 0.70710677;
        auVar56._8_4_ = auVar22._8_4_ * 0.70710677;
        auVar56._12_4_ = auVar22._12_4_ * 0.70710677;
        auVar27 = vshufps_avx(auVar56,auVar56,0xe1);
        auVar24 = vsubps_avx(auVar23,auVar24);
        auVar22 = vsubps_avx(auVar59,auVar26);
        auVar22 = vshufps_avx(auVar22,auVar22,0xe1);
        auVar57._0_4_ = auVar24._0_4_ + auVar22._0_4_;
        auVar57._4_4_ = auVar24._4_4_ + auVar22._4_4_;
        auVar57._8_4_ = auVar24._8_4_ + auVar22._8_4_;
        auVar57._12_4_ = auVar24._12_4_ + auVar22._12_4_;
        auVar26 = vsubps_avx(auVar24,auVar22);
        auVar22 = vblendps_avx(auVar57,auVar26,2);
        auVar63._0_4_ = auVar57._0_4_ + auVar27._0_4_;
        auVar63._4_4_ = auVar57._4_4_ + auVar27._4_4_;
        auVar63._8_4_ = auVar57._8_4_ + auVar27._8_4_;
        auVar63._12_4_ = auVar57._12_4_ + auVar27._12_4_;
        auVar27 = vsubps_avx(auVar26,auVar27);
        auVar27 = vblendps_avx(auVar63,auVar27,2);
        auVar23 = vsubps_avx512vl(auVar17,auVar20);
        auVar24 = vmovshdup_avx(auVar57);
        auVar24 = vsubss_avx512f(auVar24,auVar21);
        auVar21 = vpermt2ps_avx512vl(auVar26,auVar50,auVar57);
        auVar55._0_4_ = auVar21._0_4_ + auVar21._0_4_;
        auVar55._4_4_ = auVar21._4_4_ + auVar21._4_4_;
        auVar55._8_4_ = auVar21._8_4_ + auVar21._8_4_;
        auVar55._12_4_ = auVar21._12_4_ + auVar21._12_4_;
        auVar33 = vbroadcastss_avx512f
                            (ZEXT416((uint)((auVar26._0_4_ - auVar25._0_4_) + auVar58._0_4_)));
        auVar34 = vbroadcastss_avx512f(auVar24);
        auVar25 = vpermt2ps_avx512vl(auVar33._0_16_,auVar52,auVar34._0_16_);
        auVar25 = vsubps_avx(auVar55,auVar25);
        auVar26 = vaddps_avx512vl(auVar20,auVar17);
        auVar24 = vmovlhps_avx512f(auVar15,auVar22);
        auVar22._0_8_ = auVar16._0_8_;
        auVar22._8_8_ = auVar54._8_8_;
        auVar22 = vsubps_avx(auVar24,auVar22);
        auVar7._4_8_ = auVar24._8_8_;
        auVar7._0_4_ = auVar24._4_4_ + auVar24._4_4_;
        auVar15._0_8_ = auVar7._0_8_ << 0x20;
        auVar15._8_4_ = auVar24._8_4_ + auVar24._8_4_;
        auVar15._12_4_ = auVar24._12_4_ + auVar24._12_4_;
        auVar16._8_8_ = auVar15._8_8_;
        auVar16._0_8_ = auVar22._0_8_;
        auVar27 = vshufps_avx512vl(auVar18,auVar27,0x41);
        auVar24 = vshufps_avx512vl(auVar19,auVar56,0x41);
        auVar15 = vsubps_avx512vl(auVar27,auVar24);
        auVar17._0_4_ = auVar27._0_4_ + auVar24._0_4_;
        auVar17._4_4_ = auVar27._4_4_ + auVar24._4_4_;
        auVar17._8_4_ = auVar27._8_4_ + auVar24._8_4_;
        auVar17._12_4_ = auVar27._12_4_ + auVar24._12_4_;
        auVar27._0_8_ = auVar15._0_8_;
        auVar27._8_8_ = auVar17._8_8_;
        auVar24 = vaddps_avx512vl(auVar15,auVar22);
        auVar27 = vsubps_avx(auVar16,auVar27);
        auVar22 = vblendps_avx(auVar27,auVar24,2);
        auVar35 = vinsertf32x4_avx512f
                            (ZEXT3264(CONCAT1616(auVar22,CONCAT88(auVar25._8_8_,auVar26._0_8_))),
                             auVar23,2);
        auVar29._0_40_ = auVar35._0_40_;
        auVar29._40_4_ = auVar33._40_4_;
        auVar29._44_4_ = auVar34._44_4_;
        auVar29._48_4_ = auVar35._48_4_;
        auVar29._52_4_ = auVar35._52_4_;
        auVar29._56_4_ = auVar35._56_4_;
        auVar29._60_4_ = auVar35._60_4_;
        auVar33 = vinsertf32x4_avx512f(auVar29,auVar24,3);
        vpermt2ps_avx512f(auVar33,auVar30,ZEXT1664(auVar27));
        auVar33 = vpermt2pd_avx512f(auVar31,ZEXT1664(auVar17));
        auVar33 = vmulps_avx512f(auVar33,auVar32);
        *(undefined1 (*) [64])ioptr = auVar33;
        ioptr = (float *)((long)*(undefined1 (*) [64])ioptr + (2L << (M & 0x3fU)) * 4);
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    break;
  default:
    if (0 < Rows) {
      StageCnt = (M + -1) / 3;
      lVar12 = M + -1 + StageCnt * -3;
      uVar11 = ((ulong)(1L << (M & 0x3fU)) >> 3) + 0xf & 0xfffffffffffffff0;
      auVar30 = vpbroadcastq_avx512f();
      auVar30 = vmovdqu64_avx512f(auVar30);
      do {
        scbitrevR2(ioptr,M,BRLow,scale);
        uVar10 = (ulong)(lVar12 == 1) * 2 + 2;
        if (2 < (ulong)M && lVar12 == 1) {
          uVar10 = 0;
          auVar31 = vmovdqu64_avx512f(auVar30);
          auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pfVar9 = ioptr;
          do {
            auVar34 = vpbroadcastq_avx512f();
            auVar35 = vporq_avx512f(auVar34,auVar32);
            auVar34 = vporq_avx512f(auVar34,auVar33);
            uVar4 = vpcmpuq_avx512f(auVar34,auVar31,2);
            bVar5 = (byte)uVar4;
            uVar4 = vpcmpuq_avx512f(auVar35,auVar31,2);
            bVar6 = (byte)uVar4;
            uVar13 = CONCAT11(bVar6,bVar5);
            uVar14 = (ulong)uVar13;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11));
            auVar35._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar35._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar35._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar35._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar35._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar35._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar35._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar35._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar35._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar35._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar35._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar35._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar35._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar35._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar35._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar35._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 0x10));
            auVar39._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar39._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar39._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar39._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar39._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar39._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar39._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar39._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar39._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar39._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar39._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar39._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar39._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar39._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar39._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar39._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 4));
            auVar40._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar40._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar40._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar40._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar40._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar40._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar40._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar40._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar40._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar40._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar40._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar40._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar40._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar40._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar40._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar40._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 0x14));
            auVar41._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar41._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar41._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar41._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar41._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar41._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar41._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar41._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar41._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar41._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar41._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar41._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar41._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar41._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar41._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar41._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 0x20));
            auVar42._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar42._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar42._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar42._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar42._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar42._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar42._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar42._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar42._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar42._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar42._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar42._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar42._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar42._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar42._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar42._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 0x30));
            auVar49._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar49._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar49._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar49._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar49._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar49._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar49._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar49._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar49._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar49._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar49._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar49._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar49._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar49._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar49._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar49._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar36 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 0x24));
            auVar34._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar36._4_4_;
            auVar34._0_4_ = (uint)(bVar5 & 1) * auVar36._0_4_;
            auVar34._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar36._8_4_;
            auVar34._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar36._12_4_;
            auVar34._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar36._16_4_;
            auVar34._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar36._20_4_;
            auVar34._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar36._24_4_;
            auVar34._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar36._28_4_;
            auVar34._32_4_ = (uint)(bVar6 & 1) * auVar36._32_4_;
            auVar34._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar36._36_4_;
            auVar34._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar36._40_4_;
            auVar34._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar36._44_4_;
            auVar34._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar36._48_4_;
            auVar34._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar36._52_4_;
            auVar34._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar36._56_4_;
            auVar34._60_4_ = (uint)(bVar6 >> 7) * auVar36._60_4_;
            auVar36 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + uVar11 + 0x34));
            auVar37._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar36._4_4_;
            auVar37._0_4_ = (uint)(bVar5 & 1) * auVar36._0_4_;
            auVar37._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar36._8_4_;
            auVar37._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar36._12_4_;
            auVar37._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar36._16_4_;
            auVar37._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar36._20_4_;
            auVar37._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar36._24_4_;
            auVar37._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar36._28_4_;
            auVar37._32_4_ = (uint)(bVar6 & 1) * auVar36._32_4_;
            auVar37._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar36._36_4_;
            auVar37._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar36._40_4_;
            auVar37._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar36._44_4_;
            auVar37._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar36._48_4_;
            auVar37._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar36._52_4_;
            auVar37._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar36._56_4_;
            auVar37._60_4_ = (uint)(bVar6 >> 7) * auVar36._60_4_;
            auVar36 = vaddps_avx512f(auVar39,auVar35);
            auVar38 = vaddps_avx512f(auVar41,auVar40);
            auVar35 = vsubps_avx512f(auVar35,auVar39);
            auVar39 = vsubps_avx512f(auVar40,auVar41);
            auVar40 = vaddps_avx512f(auVar49,auVar42);
            auVar41 = vaddps_avx512f(auVar37,auVar34);
            auVar42 = vsubps_avx512f(auVar42,auVar49);
            auVar34 = vsubps_avx512f(auVar34,auVar37);
            vscatterdps_avx512f(ZEXT864(pfVar9) + _DAT_00107580,uVar14,auVar36);
            vscatterdps_avx512f(ZEXT864(pfVar9) + _DAT_001075c0,uVar14,auVar38);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x10) + _DAT_00107580,uVar14,auVar35);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x10) + _DAT_001075c0,uVar14,auVar39);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x20) + _DAT_00107580,uVar14,auVar40);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x20) + _DAT_001075c0,uVar14,auVar41);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x30) + _DAT_00107580,uVar14,auVar42);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x30) + _DAT_001075c0,uVar14,auVar34);
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + M));
            auVar36._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar36._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar36._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar36._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar36._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar36._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar36._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar36._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar36._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar36._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar36._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 * 2 + 0x10));
            auVar38._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar38._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar38._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar38._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar38._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar38._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar38._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar38._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar38._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar38._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar38._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar38._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar38._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar38._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar38._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar38._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 * 2));
            auVar43._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar43._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar43._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar43._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar43._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar43._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar43._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar43._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar43._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar43._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar43._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar43._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar43._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar43._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar43._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar43._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + M + 0x10));
            auVar44._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar44._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar44._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar44._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar44._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar44._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar44._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar44._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar44._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar44._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar44._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar44._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar44._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar44._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar44._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar44._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + M + 0x20));
            auVar45._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar45._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar45._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar45._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar45._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar45._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar45._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar45._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar45._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar45._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar45._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar45._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar45._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar45._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar45._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar45._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 * 2 + 0x30));
            auVar46._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar46._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar46._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar46._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar46._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar46._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar46._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar46._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar46._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar46._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar46._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar46._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar46._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar46._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar46._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar46._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 * 2 + 0x20));
            auVar47._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar47._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar47._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar47._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar47._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar47._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar47._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar47._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar47._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar47._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar47._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar47._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar47._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar47._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar47._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar47._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar9 + M + 0x30));
            auVar48._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar34._4_4_;
            auVar48._0_4_ = (uint)(bVar5 & 1) * auVar34._0_4_;
            auVar48._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar34._8_4_;
            auVar48._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar34._12_4_;
            auVar48._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar34._16_4_;
            auVar48._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar34._20_4_;
            auVar48._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar34._24_4_;
            auVar48._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar34._28_4_;
            auVar48._32_4_ = (uint)(bVar6 & 1) * auVar34._32_4_;
            auVar48._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar34._36_4_;
            auVar48._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar34._40_4_;
            auVar48._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar34._44_4_;
            auVar48._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar34._48_4_;
            auVar48._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar34._52_4_;
            auVar48._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar34._56_4_;
            auVar48._60_4_ = (uint)(bVar6 >> 7) * auVar34._60_4_;
            auVar34 = vsubps_avx512f(auVar36,auVar38);
            auVar35 = vaddps_avx512f(auVar44,auVar43);
            auVar39 = vaddps_avx512f(auVar38,auVar36);
            auVar40 = vsubps_avx512f(auVar43,auVar44);
            auVar41 = vsubps_avx512f(auVar45,auVar46);
            auVar42 = vaddps_avx512f(auVar48,auVar47);
            auVar49 = vaddps_avx512f(auVar46,auVar45);
            auVar36 = vsubps_avx512f(auVar47,auVar48);
            vscatterdps_avx512f(ZEXT864(pfVar9) + _DAT_00107600,uVar14,auVar34);
            vscatterdps_avx512f(ZEXT864(pfVar9) + auVar39,uVar14,auVar35);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x10) + _DAT_00107600,uVar14,auVar39);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x10) + auVar39,uVar14,auVar40);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x20) + _DAT_00107600,uVar14,auVar41);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x20) + auVar39,uVar14,auVar42);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x30) + _DAT_00107600,uVar14,auVar49);
            vscatterdps_avx512f(ZEXT864(pfVar9) + ZEXT864(0x30) + auVar39,uVar14,auVar36);
            uVar10 = uVar10 + 0x10;
            pfVar9 = pfVar9 + 0x100;
          } while (uVar11 != uVar10);
          uVar10 = 4;
        }
        if (lVar12 == 2) {
          ibfR4(ioptr,M,uVar10);
          uVar10 = (ulong)(uint)((int)uVar10 << 2);
        }
        if ((ulong)M < 0xc) {
          ibfstages(ioptr,M,Utbl,1,uVar10,StageCnt);
        }
        else {
          ifftrecurs(ioptr,M,Utbl,1,uVar10,StageCnt);
        }
        ioptr = ioptr + (2L << (M & 0x3fU));
        bVar3 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void iffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place inverse complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;
const float scale = 1.0/POW2(M);

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		ifft2pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		ifft4pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		ifft8pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);	/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			ibfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			ifftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}